

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2MatchNumberPeculiarity(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_1990;
  LogMessage local_1810;
  string *local_1690;
  RE2 local_1688;
  StringPiece local_15a8;
  string local_1598 [8];
  string a;
  LogMessage local_1578;
  string *local_13f8;
  string *local_13f0;
  string *local_13e8;
  StringPiece local_13e0;
  LogMessage local_13d0;
  LogMessage local_1250;
  LogMessage local_10d0;
  LogMessage local_f50;
  string *local_dd0;
  string *local_dc8;
  string *local_dc0;
  StringPiece local_db8;
  LogMessage local_da8;
  LogMessage local_c28;
  LogMessage local_aa8;
  LogMessage local_928;
  string *local_7a8;
  string *local_7a0;
  string *local_798;
  StringPiece local_790;
  LogMessage local_780;
  LogMessage local_600;
  LogMessage local_480;
  LogMessage local_300;
  string *local_180;
  string *local_178;
  string *local_170 [3];
  StringPiece local_158;
  string local_148 [8];
  string word3;
  string local_128 [8];
  string word2;
  string local_108 [8];
  string word1;
  undefined1 local_e8 [8];
  RE2 r;
  
  RE2::RE2((RE2 *)local_e8,"(foo)|(bar)|(baz)");
  std::__cxx11::string::string(local_108);
  std::__cxx11::string::string(local_128);
  std::__cxx11::string::string(local_148);
  StringPiece::StringPiece(&local_158,"foo");
  local_170[0] = local_108;
  local_178 = local_128;
  local_180 = local_148;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_158,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_170
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      &local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_180);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x145);
    poVar2 = LogMessage::stream(&local_300);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"foo\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_300);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"foo");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_480,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x146);
    poVar2 = LogMessage::stream(&local_480);
    std::operator<<(poVar2,"Check failed: (word1) == (\"foo\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_480);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_128,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_600,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x147);
    poVar2 = LogMessage::stream(&local_600);
    std::operator<<(poVar2,"Check failed: (word2) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_600);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_148,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_780,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x148);
    poVar2 = LogMessage::stream(&local_780);
    std::operator<<(poVar2,"Check failed: (word3) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_780);
  }
  StringPiece::StringPiece(&local_790,"bar");
  local_798 = local_108;
  local_7a0 = local_128;
  local_7a8 = local_148;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_790,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_798,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_7a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_7a8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_928,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x149);
    poVar2 = LogMessage::stream(&local_928);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"bar\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_928);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_aa8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14a);
    poVar2 = LogMessage::stream(&local_aa8);
    std::operator<<(poVar2,"Check failed: (word1) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_aa8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_128,"bar");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c28,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14b);
    poVar2 = LogMessage::stream(&local_c28);
    std::operator<<(poVar2,"Check failed: (word2) == (\"bar\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c28);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_148,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_da8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14c);
    poVar2 = LogMessage::stream(&local_da8);
    std::operator<<(poVar2,"Check failed: (word3) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_da8);
  }
  StringPiece::StringPiece(&local_db8,"baz");
  local_dc0 = local_108;
  local_dc8 = local_128;
  local_dd0 = local_148;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_db8,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_dc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_dc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_dd0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f50,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14d);
    poVar2 = LogMessage::stream(&local_f50);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"baz\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f50);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_10d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14e);
    poVar2 = LogMessage::stream(&local_10d0);
    std::operator<<(poVar2,"Check failed: (word1) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_10d0);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_128,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1250,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14f);
    poVar2 = LogMessage::stream(&local_1250);
    std::operator<<(poVar2,"Check failed: (word2) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1250);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_148,"baz");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_13d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x150);
    poVar2 = LogMessage::stream(&local_13d0);
    std::operator<<(poVar2,"Check failed: (word3) == (\"baz\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_13d0);
  }
  StringPiece::StringPiece(&local_13e0,"f");
  local_13e8 = local_108;
  local_13f0 = local_128;
  local_13f8 = local_148;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    (&local_13e0,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_13e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_13f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_13f8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1578,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x151);
    poVar2 = LogMessage::stream(&local_1578);
    std::operator<<(poVar2,"Check failed: !RE2::PartialMatch(\"f\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1578);
  }
  std::__cxx11::string::string(local_1598);
  StringPiece::StringPiece(&local_15a8,"hello");
  RE2::RE2(&local_1688,"(foo)|hello");
  local_1690 = local_1598;
  bVar1 = RE2::FullMatch<std::__cxx11::string*>
                    (&local_15a8,&local_1688,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_1690);
  RE2::~RE2(&local_1688);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1810,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x154);
    poVar2 = LogMessage::stream(&local_1810);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"hello\", \"(foo)|hello\", &a)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1810);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1598,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1990,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x155);
    poVar2 = LogMessage::stream(&local_1990);
    std::operator<<(poVar2,"Check failed: (a) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1990);
  }
  std::__cxx11::string::~string(local_1598);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  RE2::~RE2((RE2 *)local_e8);
  return;
}

Assistant:

TEST(RE2, MatchNumberPeculiarity) {
  VLOG(1) << "TestMatchNumberPeculiarity";

  RE2 r("(foo)|(bar)|(baz)");
  string word1;
  string word2;
  string word3;

  CHECK(RE2::PartialMatch("foo", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "foo");
  CHECK_EQ(word2, "");
  CHECK_EQ(word3, "");
  CHECK(RE2::PartialMatch("bar", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "");
  CHECK_EQ(word2, "bar");
  CHECK_EQ(word3, "");
  CHECK(RE2::PartialMatch("baz", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "");
  CHECK_EQ(word2, "");
  CHECK_EQ(word3, "baz");
  CHECK(!RE2::PartialMatch("f", r, &word1, &word2, &word3));

  string a;
  CHECK(RE2::FullMatch("hello", "(foo)|hello", &a));
  CHECK_EQ(a, "");
}